

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O2

bool libaom_examples::parse_multilayer_file(char *metadata_path,MultilayerMetadata *multilayer)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  byte bVar3;
  ushort uVar4;
  MultilayerUseCase MVar5;
  DepthRepresentationElement DVar6;
  DepthRepresentationElement DVar7;
  DepthRepresentationElement DVar8;
  DepthRepresentationElement DVar9;
  LayerMetadata *pLVar10;
  char cVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  pointer pLVar16;
  ulong uVar17;
  long lVar18;
  int *indent_00;
  bool *max;
  int64_t max_00;
  pointer pLVar19;
  LayerMetadata *layer;
  bool *pbVar20;
  char *pcVar21;
  pointer pLVar22;
  string *this;
  pointer pLVar23;
  uint8_t *v;
  uint16_t *v_00;
  AlphaInformation *v_01;
  undefined8 uVar24;
  int iVar25;
  undefined8 uVar26;
  ulong uVar27;
  uint8_t *puVar28;
  undefined8 uVar29;
  int64_t iVar30;
  ulong uVar31;
  undefined8 uVar32;
  ulong uVar33;
  undefined8 uVar34;
  ulong uVar35;
  int line_idx;
  bool syntax_error_2;
  bool syntax_error;
  bool syntax_error_1;
  bool has_list_prefix_1;
  bool syntax_error_3;
  DepthRepresentationElement el;
  int indent_1;
  int local_3a0;
  bool has_list_prefix;
  AlphaInformation *local_398;
  int indent;
  bool has_list_prefix_2;
  bool bStack_38a;
  uint8_t uStack_389;
  ParsedValue value_2;
  ParsedValue value_1;
  int indent_2;
  int64_t local_340;
  double dStack_338;
  int local_32c;
  string field_name_2;
  string field_name_1;
  string field_name;
  ParsedValue value;
  ifstream file;
  
  std::ifstream::ifstream(&file,metadata_path,_S_in);
  cVar11 = std::__basic_file<char>::is_open();
  if (cVar11 != '\0') {
    line_idx = 0;
    indent = -1;
    field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
    field_name._M_string_length = 0;
    value.type_ = kNone;
    field_name.field_2._M_local_buf[0] = '\0';
    value.int_value_ = 0;
    value.double_value_ = 0.0;
    field_name_2._M_dataplus._M_p = field_name_2._M_dataplus._M_p & 0xffffffff00000000;
    field_name_2._M_string_length._0_4_ = 0;
    field_name_2._M_string_length._4_2_ = 0;
    field_name_2._M_string_length._6_2_ = 0;
    field_name_2.field_2._M_allocated_capacity._0_4_ = 0;
    field_name_2.field_2._M_allocated_capacity._4_4_ = 0;
    field_name_2.field_2._8_4_ = 0;
    field_name_2.field_2._12_4_ = 0;
    MultilayerMetadata::operator=(multilayer,(MultilayerMetadata *)&field_name_2);
    std::
    _Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>::
    ~_Vector_base((_Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                   *)&field_name_2._M_string_length);
LAB_00129702:
    bVar12 = anon_unknown_0::parse_line
                       (&file,0,false,&indent,&has_list_prefix,&line_idx,&field_name,&value,
                        &syntax_error);
    if (!bVar12) goto LAB_0012a1ab;
    bVar12 = std::operator==(&field_name,"use_case");
    if (bVar12) {
      if (value.type_ != kInteger) {
        if (value.type_ == kFloatingPoint) {
          pcVar21 = "Floating point value found where integer was expected at line %d\n";
        }
        else {
          pcVar21 = "No value found where integer was expected at line %d\n";
        }
        fprintf(_stderr,pcVar21,(ulong)(uint)line_idx);
        goto LAB_0012a795;
      }
      if ((ulong)value.int_value_ < 0x40) {
        multilayer->use_case = (MultilayerUseCase)value.int_value_;
        goto LAB_00129702;
      }
      fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",value.int_value_,0,
              0x3f);
    }
    else {
      bVar12 = std::operator==(&field_name,"layers");
      if (bVar12) {
        indent_1 = -1;
        field_name_1._M_dataplus._M_p = (pointer)&field_name_1.field_2;
        field_name_1._M_string_length = 0;
        local_32c = indent + 1;
        value_1.type_ = kNone;
        field_name_1.field_2._M_local_buf[0] = '\0';
        value_1.int_value_ = 0;
        value_1.double_value_ = 0.0;
        bVar12 = false;
        bVar14 = false;
LAB_001297d8:
        do {
          pLVar23 = (pointer)&has_list_prefix_1;
          bVar13 = anon_unknown_0::parse_line
                             (&file,local_32c,true,&indent_1,(bool *)pLVar23,&line_idx,&field_name_1
                              ,&value_1,&syntax_error_1);
          uVar15 = (uint)bVar14;
          if (!bVar13) goto LAB_0012a169;
          if (has_list_prefix_1 == true) {
            pLVar23 = (multilayer->layers).
                      super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pLVar16 = (multilayer->layers).
                      super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (3 < (ulong)(((long)pLVar16 - (long)pLVar23) / 100)) {
              fprintf(_stderr,"Error: Too many layers at line %d, the maximum is %d\n",
                      (ulong)(uint)line_idx,4);
              goto LAB_0012a788;
            }
            pLVar22 = pLVar16;
            if (pLVar23 != pLVar16) {
              anon_unknown_0::validate_layer(pLVar16 + -1,bVar12,bVar14);
              pLVar16 = (multilayer->layers).
                        super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pLVar22 = (multilayer->layers).
                        super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
            lVar18 = (long)pLVar22 - (long)pLVar16;
            if ((lVar18 == 100) && (pLVar22[-1].layer_color_description.second == true)) {
              fwrite("Error: layer_color_description cannot be specified for the first layer\n",0x47
                     ,1,_stderr);
              goto LAB_0012a788;
            }
            field_name_2._M_dataplus._M_p = field_name_2._M_dataplus._M_p & 0xffffff0000000000;
            field_name_2._M_string_length._0_4_ = 0;
            field_name_2._M_string_length._4_2_ = 0;
            field_name_2.field_2._M_allocated_capacity._0_4_ = 0;
            field_name_2.field_2._M_allocated_capacity._4_4_ = 0;
            field_name_2.field_2._8_4_ = field_name_2.field_2._8_4_ & 0xffffff00;
            field_name_2.field_2._12_4_ = 0;
            std::
            vector<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
            ::emplace_back<libaom_examples::LayerMetadata>
                      (&multilayer->layers,(LayerMetadata *)&field_name_2);
            uVar15 = (uint)lVar18;
            bVar12 = false;
            bVar14 = false;
          }
          pLVar16 = (multilayer->layers).
                    super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((multilayer->layers).
              super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ._M_impl.super__Vector_impl_data._M_start == pLVar16) {
            uVar17 = (ulong)(uint)line_idx;
            pcVar21 = "Error: Missing list prefix \'-\' at line %d\n";
LAB_0012a38c:
            fprintf(_stderr,pcVar21,uVar17);
            goto LAB_0012a788;
          }
          bVar13 = std::operator==(&field_name_1,"layer_type");
          if (!bVar13) {
            bVar13 = std::operator==(&field_name_1,"luma_plane_only_flag");
            if (bVar13) {
              bVar13 = anon_unknown_0::ParsedValue::IntegerValueInRange<bool>
                                 (&value_1,(ulong)(uint)line_idx,
                                  (int64_t)&pLVar16[-1].luma_plane_only_flag,uVar15,(bool *)pLVar23)
              ;
            }
            else {
              bVar13 = std::operator==(&field_name_1,"layer_view_type");
              if (bVar13) {
                uVar17 = (ulong)(uint)line_idx;
                if (value_1.type_ != kInteger) goto LAB_0012a320;
                if (7 < (ulong)value_1.int_value_) {
                  uVar32 = 7;
LAB_0012a3cf:
                  fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n",
                          value_1.int_value_,0,uVar32);
                  goto LAB_0012a788;
                }
                pLVar16[-1].layer_view_type = (MultilayerViewType)value_1.int_value_;
                goto LAB_001297d8;
              }
              bVar13 = std::operator==(&field_name_1,"group_id");
              if (bVar13) {
                puVar28 = &pLVar16[-1].group_id;
                iVar30 = 3;
              }
              else {
                bVar13 = std::operator==(&field_name_1,"layer_dependency_idc");
                if (!bVar13) {
                  bVar13 = std::operator==(&field_name_1,"layer_metadata_scope");
                  if (bVar13) {
                    uVar17 = (ulong)(uint)line_idx;
                    if (value_1.type_ != kInteger) goto LAB_0012a320;
                    if (3 < (ulong)value_1.int_value_) {
                      uVar32 = 3;
                      goto LAB_0012a3cf;
                    }
                    pLVar16[-1].layer_metadata_scope = (MultilayerMetadataScope)value_1.int_value_;
                  }
                  else {
                    bVar13 = std::operator==(&field_name_1,"layer_color_description");
                    if (bVar13) {
                      bVar13 = anon_unknown_0::parse_color_properties
                                         (&file,indent_1,&line_idx,(ColorProperties *)&field_name_2)
                      ;
                      if (!bVar13) goto LAB_0012a788;
                      pLVar16[-1].layer_color_description.first =
                           field_name_2._M_dataplus._M_p._0_4_;
                      pLVar16[-1].layer_color_description.second = true;
                    }
                    else {
                      bVar13 = std::operator==(&field_name_1,"alpha");
                      if (bVar13) {
                        local_3a0 = indent_1 + 1;
                        local_398 = &pLVar16[-1].global_alpha_info;
                        indent_2 = -1;
                        field_name_2._M_dataplus._M_p = (pointer)&field_name_2.field_2;
                        field_name_2._M_string_length._0_4_ = 0;
                        field_name_2._M_string_length._4_2_ = 0;
                        field_name_2._M_string_length._6_2_ = 0;
                        field_name_2.field_2._M_allocated_capacity._0_4_ =
                             field_name_2.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
                        value_2._0_8_ = value_2._0_8_ & 0xffffffff00000000;
                        value_2.int_value_ = 0;
                        value_2.double_value_ = 0.0;
                        puVar28 = &pLVar16[-1].global_alpha_info.alpha_bit_depth;
                        puVar1 = &pLVar16[-1].global_alpha_info.alpha_transparent_value;
                        puVar2 = &pLVar16[-1].global_alpha_info.alpha_opaque_value;
                        pLVar16[-1].global_alpha_info.alpha_color_description.second = false;
                        pLVar16[-1].global_alpha_info.alpha_use_idc = ALPHA_STRAIGHT;
                        pLVar16[-1].global_alpha_info.alpha_simple_flag = false;
                        pLVar16[-1].global_alpha_info.alpha_bit_depth = '\0';
                        pLVar16[-1].global_alpha_info.alpha_clip_idc = '\0';
                        pLVar16[-1].global_alpha_info.alpha_incr_flag = false;
                        pLVar10 = pLVar16 + -1;
                        pLVar16[-1].global_alpha_info.alpha_transparent_value = 0;
                        pLVar16[-1].global_alpha_info.alpha_opaque_value = 0;
                        (pLVar10->global_alpha_info).alpha_color_description.first.color_range =
                             false;
                        (pLVar10->global_alpha_info).alpha_color_description.first.color_primaries =
                             '\0';
                        (pLVar10->global_alpha_info).alpha_color_description.first.
                        transfer_characteristics = '\0';
                        (pLVar10->global_alpha_info).alpha_color_description.first.
                        matrix_coefficients = '\0';
LAB_00129b8d:
                        do {
                          indent_00 = &indent_2;
                          pbVar20 = &has_list_prefix_2;
                          bVar12 = anon_unknown_0::parse_line
                                             (&file,local_3a0,false,indent_00,pbVar20,&line_idx,
                                              &field_name_2,&value_2,&syntax_error_2);
                          iVar25 = (int)indent_00;
                          if (!bVar12) goto LAB_0012a09d;
                          bVar12 = std::operator==(&field_name_2,"alpha_use_idc");
                          if (!bVar12) {
                            bVar12 = std::operator==(&field_name_2,"alpha_simple_flag");
                            max = &pLVar16[-1].global_alpha_info.alpha_simple_flag;
                            if (bVar12) {
LAB_00129c15:
                              bVar12 = anon_unknown_0::ParsedValue::IntegerValueInRange<bool>
                                                 (&value_2,(ulong)(uint)line_idx,(int64_t)max,iVar25
                                                  ,pbVar20);
                            }
                            else {
                              bVar12 = std::operator==(&field_name_2,"alpha_bit_depth");
                              if (bVar12) {
                                iVar30 = 8;
                                max_00 = 0xf;
                                v = puVar28;
                              }
                              else {
                                bVar12 = std::operator==(&field_name_2,"alpha_clip_idc");
                                if (!bVar12) {
                                  bVar12 = std::operator==(&field_name_2,"alpha_incr_flag");
                                  max = &pLVar16[-1].global_alpha_info.alpha_incr_flag;
                                  if (bVar12) goto LAB_00129c15;
                                  bVar12 = std::operator==(&field_name_2,"alpha_transparent_value");
                                  v_00 = puVar1;
                                  if ((bVar12) ||
                                     (bVar12 = std::operator==(&field_name_2,"alpha_opaque_value"),
                                     v_00 = puVar2, bVar12)) {
                                    bVar12 = anon_unknown_0::ParsedValue::
                                             IntegerValueInRange<unsigned_short>
                                                       (&value_2,0,0xffff,line_idx,v_00);
                                    goto LAB_00129c7c;
                                  }
                                  bVar12 = std::operator==(&field_name_2,"alpha_color_description");
                                  if (!bVar12) {
                                    fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",
                                            field_name_2._M_dataplus._M_p,(ulong)(uint)line_idx);
                                    goto LAB_0012a54f;
                                  }
                                  bVar12 = anon_unknown_0::parse_color_properties
                                                     (&file,indent_2,&line_idx,
                                                      (ColorProperties *)&el);
                                  if (!bVar12) goto LAB_0012a54f;
                                  pLVar23 = pLVar16 + -1;
                                  (pLVar23->global_alpha_info).alpha_color_description.first.
                                  color_range = el.sign_flag;
                                  (pLVar23->global_alpha_info).alpha_color_description.first.
                                  color_primaries = el.exponent;
                                  (pLVar23->global_alpha_info).alpha_color_description.first.
                                  transfer_characteristics = el.mantissa_len;
                                  (pLVar23->global_alpha_info).alpha_color_description.first.
                                  matrix_coefficients = el._3_1_;
                                  pLVar16[-1].global_alpha_info.alpha_color_description.second =
                                       true;
                                  goto LAB_00129b8d;
                                }
                                iVar30 = 0;
                                max_00 = 3;
                                v = &pLVar16[-1].global_alpha_info.alpha_clip_idc;
                              }
                              bVar12 = anon_unknown_0::ParsedValue::
                                       IntegerValueInRange<unsigned_char>
                                                 (&value_2,iVar30,max_00,line_idx,v);
                            }
LAB_00129c7c:
                            if (bVar12 == false) goto LAB_0012a54f;
                            goto LAB_00129b8d;
                          }
                          uVar17 = (ulong)(uint)line_idx;
                          if (value_2.type_ != kInteger) {
                            if (value_2.type_ == kFloatingPoint) {
                              pcVar21 = 
                              "Floating point value found where integer was expected at line %d\n";
                            }
                            else {
                              pcVar21 = "No value found where integer was expected at line %d\n";
                            }
                            goto LAB_0012a528;
                          }
                          if (7 < (ulong)value_2.int_value_) {
                            fprintf(_stderr,"Integer value %ld out of range [%ld, %ld] at line %d\n"
                                    ,value_2.int_value_,0,7);
                            goto LAB_0012a54f;
                          }
                          local_398->alpha_use_idc = (AlphaUse)value_2.int_value_;
                        } while( true );
                      }
                      bVar14 = std::operator==(&field_name_1,"depth");
                      if (!bVar14) {
                        fprintf(_stderr,"Error: Unknown field %s at line %d\n",
                                field_name_1._M_dataplus._M_p,(ulong)(uint)line_idx);
                        goto LAB_0012a788;
                      }
                      local_3a0 = indent_1 + 1;
                      _has_list_prefix_2 = 0xffff;
                      bStack_38a = true;
                      uStack_389 = 0xff;
                      value_2._0_8_ = &value_2.double_value_;
                      value_2.int_value_ = 0;
                      value_2.double_value_ =
                           (double)((ulong)value_2.double_value_ & 0xffffffffffffff00);
                      indent_2 = 0;
                      local_340 = 0;
                      dStack_338 = 0.0;
                      field_name_2._M_dataplus._M_p = (pointer)0x0;
                      field_name_2._M_string_length._0_4_ =
                           (uint)field_name_2._M_string_length & 0xffffff00;
                      field_name_2._M_string_length._4_2_ = 0;
                      field_name_2._M_string_length._6_2_ = 0;
                      field_name_2.field_2._M_allocated_capacity._0_4_ = 0;
                      field_name_2.field_2._M_allocated_capacity._4_4_ =
                           field_name_2.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
                      field_name_2.field_2._8_4_ = 0;
                      field_name_2.field_2._12_4_ = 0;
                      DepthInformation::operator=
                                (&pLVar16[-1].global_depth_info,(DepthInformation *)&field_name_2);
                      local_398 = (AlphaInformation *)
                                  &pLVar16[-1].global_depth_info.disparity_ref_view_id;
                      while (bVar13 = anon_unknown_0::parse_line
                                                (&file,local_3a0,false,(int *)&has_list_prefix_2,
                                                 &syntax_error_2,&line_idx,(string *)&value_2,
                                                 (ParsedValue *)&indent_2,&syntax_error_3),
                            bVar14 = syntax_error_3, bVar13) {
                        bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&value_2,"z_near");
                        if (bVar14) {
                          bVar14 = anon_unknown_0::ParsedValue::ValueAsFloatingPoint
                                             ((ParsedValue *)&indent_2,line_idx,
                                              (double *)&field_name_2);
                          if ((!bVar14) ||
                             (bVar14 = double_to_depth_representation_element
                                                 ((double)field_name_2._M_dataplus._M_p,&el),
                             !bVar14)) goto LAB_0012a77e;
                          DVar6.mantissa = el.mantissa;
                          DVar6.sign_flag = el.sign_flag;
                          DVar6.exponent = el.exponent;
                          DVar6.mantissa_len = el.mantissa_len;
                          DVar6._3_1_ = el._3_1_;
                          pLVar16[-1].global_depth_info.z_near.first = DVar6;
                          pLVar16[-1].global_depth_info.z_near.second = true;
                        }
                        else {
                          bVar14 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&value_2,"z_far");
                          if (bVar14) {
                            bVar14 = anon_unknown_0::ParsedValue::ValueAsFloatingPoint
                                               ((ParsedValue *)&indent_2,line_idx,
                                                (double *)&field_name_2);
                            if ((!bVar14) ||
                               (bVar14 = double_to_depth_representation_element
                                                   ((double)field_name_2._M_dataplus._M_p,&el),
                               !bVar14)) goto LAB_0012a77e;
                            DVar7.mantissa = el.mantissa;
                            DVar7.sign_flag = el.sign_flag;
                            DVar7.exponent = el.exponent;
                            DVar7.mantissa_len = el.mantissa_len;
                            DVar7._3_1_ = el._3_1_;
                            pLVar16[-1].global_depth_info.z_far.first = DVar7;
                            pLVar16[-1].global_depth_info.z_far.second = true;
                          }
                          else {
                            bVar14 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&value_2,"d_min");
                            if (bVar14) {
                              bVar14 = anon_unknown_0::ParsedValue::ValueAsFloatingPoint
                                                 ((ParsedValue *)&indent_2,line_idx,
                                                  (double *)&field_name_2);
                              if ((!bVar14) ||
                                 (bVar14 = double_to_depth_representation_element
                                                     ((double)field_name_2._M_dataplus._M_p,&el),
                                 !bVar14)) goto LAB_0012a77e;
                              DVar8.mantissa = el.mantissa;
                              DVar8.sign_flag = el.sign_flag;
                              DVar8.exponent = el.exponent;
                              DVar8.mantissa_len = el.mantissa_len;
                              DVar8._3_1_ = el._3_1_;
                              pLVar16[-1].global_depth_info.d_min.first = DVar8;
                              pLVar16[-1].global_depth_info.d_min.second = true;
                            }
                            else {
                              bVar14 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&value_2,"d_max");
                              if (bVar14) {
                                bVar14 = anon_unknown_0::ParsedValue::ValueAsFloatingPoint
                                                   ((ParsedValue *)&indent_2,line_idx,
                                                    (double *)&field_name_2);
                                if ((!bVar14) ||
                                   (bVar14 = double_to_depth_representation_element
                                                       ((double)field_name_2._M_dataplus._M_p,&el),
                                   !bVar14)) goto LAB_0012a77e;
                                DVar9.mantissa = el.mantissa;
                                DVar9.sign_flag = el.sign_flag;
                                DVar9.exponent = el.exponent;
                                DVar9.mantissa_len = el.mantissa_len;
                                DVar9._3_1_ = el._3_1_;
                                pLVar16[-1].global_depth_info.d_max.first = DVar9;
                                pLVar16[-1].global_depth_info.d_max.second = true;
                              }
                              else {
                                bVar14 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&value_2,"depth_representation_type");
                                if (bVar14) {
                                  iVar30 = 0xf;
                                  v_01 = (AlphaInformation *)
                                         &pLVar16[-1].global_depth_info.depth_representation_type;
                                }
                                else {
                                  bVar14 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&value_2,"disparity_ref_view_id");
                                  if (!bVar14) {
                                    fprintf(_stderr,"Error: Unknown field \'%s\' at line %d\n",
                                            value_2._0_8_,(ulong)(uint)line_idx);
                                    goto LAB_0012a77e;
                                  }
                                  iVar30 = 3;
                                  v_01 = local_398;
                                }
                                bVar14 = anon_unknown_0::ParsedValue::
                                         IntegerValueInRange<unsigned_char>
                                                   ((ParsedValue *)&indent_2,0,iVar30,line_idx,
                                                    (uchar *)v_01);
                                if (!bVar14) {
LAB_0012a77e:
                                  this = (string *)&value_2;
                                  goto LAB_0012a783;
                                }
                              }
                            }
                          }
                        }
                      }
                      std::__cxx11::string::~string((string *)&value_2);
                      if (bVar14 != false) goto LAB_0012a788;
                      if ((pLVar16[-1].global_depth_info.d_min.second != false) ||
                         (bVar14 = true, pLVar16[-1].global_depth_info.d_max.second == true)) {
                        lVar18 = ((long)(multilayer->layers).
                                        super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(multilayer->layers).
                                       super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 100;
                        bVar14 = true;
                        if (lVar18 - 1U == (ulong)(byte)(char)local_398->alpha_use_idc) {
                          pcVar21 = 
                          "disparity_ref_view_id must be different from the layer\'s id for layer %d (zero-based index)\n"
                          ;
                          uVar17 = (ulong)((int)lVar18 - 1);
                          goto LAB_0012a38c;
                        }
                      }
                    }
                  }
                  goto LAB_001297d8;
                }
                puVar28 = &pLVar16[-1].layer_dependency_idc;
                iVar30 = 7;
              }
              bVar13 = anon_unknown_0::ParsedValue::IntegerValueInRange<unsigned_char>
                                 (&value_1,0,iVar30,line_idx,puVar28);
            }
            if (bVar13 == false) goto LAB_0012a788;
            goto LAB_001297d8;
          }
          uVar17 = (ulong)(uint)line_idx;
          if (value_1.type_ != kInteger) {
LAB_0012a320:
            if (value_1.type_ == kFloatingPoint) {
              pcVar21 = "Floating point value found where integer was expected at line %d\n";
            }
            else {
              pcVar21 = "No value found where integer was expected at line %d\n";
            }
            goto LAB_0012a38c;
          }
          if (0x1f < (ulong)value_1.int_value_) {
            uVar32 = 0x1f;
            goto LAB_0012a3cf;
          }
          pLVar16[-1].layer_type = (LayerType)value_1.int_value_;
        } while( true );
      }
      fprintf(_stderr,"Error: Unknown field %s at line %d\n",field_name._M_dataplus._M_p,
              (ulong)(uint)line_idx);
    }
    goto LAB_0012a795;
  }
  bVar12 = false;
  fprintf(_stderr,"Error: Failed to open %s\n",metadata_path);
  goto LAB_0012a7a4;
LAB_0012a169:
  if (syntax_error_1 == false) {
    anon_unknown_0::validate_layer
              ((multilayer->layers).
               super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,bVar12,bVar14);
    std::__cxx11::string::~string((string *)&field_name_1);
    goto LAB_00129702;
  }
LAB_0012a788:
  std::__cxx11::string::~string((string *)&field_name_1);
LAB_0012a795:
  std::__cxx11::string::~string((string *)&field_name);
  goto LAB_0012a7a2;
LAB_0012a09d:
  if (syntax_error_2 == false) {
    bVar3 = *puVar28;
    if (bVar3 == 0) {
      fwrite("Error: alpha_bit_depth must be specified (in range [8, 15]) for alpha info\n",0x4b,1,
             _stderr);
    }
    else {
      uVar15 = 2 << (bVar3 & 0x1f);
      uVar4 = *puVar1;
      if ((int)(uint)uVar4 < (int)uVar15) {
        uVar4 = *puVar2;
        if (uVar4 < uVar15) {
          if ((pLVar16[-1].global_alpha_info.alpha_color_description.second != true) ||
             (local_398->alpha_use_idc == ALPHA_STRAIGHT)) {
            std::__cxx11::string::~string((string *)&field_name_2);
            bVar12 = true;
            goto LAB_001297d8;
          }
          pcVar21 = "Error: alpha_color_description can only be set if alpha_use_idc is %d\n";
          uVar17 = 0;
LAB_0012a528:
          fprintf(_stderr,pcVar21,uVar17);
          goto LAB_0012a54f;
        }
        pcVar21 = "Error: alpha_opaque_value %d out of range [0, %d]\n";
      }
      else {
        pcVar21 = "Error: alpha_transparent_value %d out of range [0, %d]\n";
      }
      fprintf(_stderr,pcVar21,(ulong)uVar4,(ulong)(uVar15 - 1));
    }
  }
LAB_0012a54f:
  this = &field_name_2;
LAB_0012a783:
  std::__cxx11::string::~string((string *)this);
  goto LAB_0012a788;
LAB_0012a1ab:
  std::__cxx11::string::~string((string *)&field_name);
  if (syntax_error == false) {
    pLVar23 = (multilayer->layers).
              super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar16 = (multilayer->layers).
              super__Vector_base<libaom_examples::LayerMetadata,_std::allocator<libaom_examples::LayerMetadata>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar23 != pLVar16) {
      uVar31 = 100;
      uVar17 = ((long)pLVar16 - (long)pLVar23) / 100;
      if (uVar17 < 5) {
        pLVar22 = pLVar23;
        do {
          pLVar19 = pLVar22;
          if (pLVar19 == pLVar16) break;
          pLVar22 = pLVar19 + 1;
        } while (pLVar19->layer_view_type == pLVar23->layer_view_type);
        MVar5 = multilayer->use_case;
        uVar33 = (ulong)MVar5;
        pbVar20 = &(pLVar23->layer_color_description).second;
        for (uVar27 = 0; uVar17 != uVar27; uVar27 = uVar27 + 1) {
          if (MVar5 < (MULTILAYER_USE_CASE_444|MULTILAYER_USE_CASE_GLOBAL_DEPTH)) {
            if ((0xce6U >> (MVar5 & 0x1f) & 1) != 0) {
              uVar35 = (ulong)*(uint *)(pbVar20 + -8);
              if (*(uint *)(pbVar20 + -8) == 2) {
                if ((MVar5 < MULTILAYER_USE_CASE_444) && ((0xc1eU >> (MVar5 & 0x1f) & 1) != 0))
                goto LAB_0012a25e;
                goto LAB_0012a267;
              }
              pcVar21 = 
              "Error: for use_case %d, all layers must have scope %d, found %d instead for layer %d (zero-based index)\n"
              ;
              uVar17 = 2;
LAB_0012a594:
              bVar12 = false;
              fprintf(_stderr,pcVar21,uVar33,uVar17,uVar35,uVar27 & 0xffffffff);
              goto LAB_0012a7a4;
            }
            if ((0x3018U >> (MVar5 & 0x1f) & 1) == 0) goto LAB_0012a267;
LAB_0012a25e:
            if (pLVar19 != pLVar16) {
              bVar12 = false;
              fprintf(_stderr,
                      "Error: for use_case %d, all layers must have the same view type, found different view_type for layer %d (zero-based index)\n"
                      ,uVar33,uVar27 & 0xffffffff);
              goto LAB_0012a7a4;
            }
          }
LAB_0012a267:
          uVar15 = *(uint *)(pbVar20 + -0x18);
          if (uVar15 != 0) {
            switch(MVar5) {
            case MULTILAYER_USE_CASE_GLOBAL_ALPHA:
            case MULTILAYER_USE_CASE_ALPHA:
            case MULTILAYER_USE_CASE_STEREO_GLOBAL_ALPHA:
            case MULTILAYER_USE_CASE_STEREO_ALPHA:
              if ((uVar15 | 4) != 5) {
                uVar34 = 5;
LAB_0012a640:
                uVar32 = 1;
                pcVar21 = 
                "Error: for use_case %d, all layers must be of type %d or %d, found %d for layer %d (zero-based index)\n"
                ;
                uVar35 = (ulong)uVar15;
                uVar17 = uVar27;
LAB_0012a649:
                bVar12 = false;
                fprintf(_stderr,pcVar21,uVar33,uVar32,uVar34,uVar35,uVar17,uVar31);
                goto LAB_0012a7a4;
              }
              break;
            case MULTILAYER_USE_CASE_GLOBAL_DEPTH:
            case MULTILAYER_USE_CASE_DEPTH:
            case MULTILAYER_USE_CASE_STEREO_GLOBAL_DEPTH:
            case MULTILAYER_USE_CASE_STEREO_DEPTH:
              if ((uVar15 != 1) && (uVar15 != 6)) {
                uVar34 = 6;
                goto LAB_0012a640;
              }
              break;
            case MULTILAYER_USE_CASE_STEREO:
              if (uVar15 != 1) {
                pcVar21 = 
                "Error: for use_case %d, all layers must be of type %d, found %d for layer %d (zero-based index)\n"
                ;
                uVar33 = 5;
                uVar17 = 1;
                uVar35 = (ulong)uVar15;
                goto LAB_0012a594;
              }
              break;
            case MULTILAYER_USE_CASE_444_GLOBAL_ALPHA:
              if (3 < uVar15 - 2) {
                uVar32 = 10;
                uVar34 = 2;
                uVar24 = 3;
                uVar26 = 4;
                uVar29 = 5;
LAB_0012a84d:
                bVar12 = false;
                fprintf(_stderr,
                        "Error: for use_case %d, all layers must be of type %d, %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                        ,uVar32,uVar34,uVar24,uVar26,uVar29,(ulong)uVar15,uVar27);
                goto LAB_0012a7a4;
              }
              break;
            case MULTILAYER_USE_CASE_444_GLOBAL_DEPTH:
              if ((6 < uVar15) || ((0x5cU >> (uVar15 & 0x1f) & 1) == 0)) {
                uVar32 = 0xb;
                uVar34 = 2;
                uVar24 = 3;
                uVar26 = 4;
                uVar29 = 6;
                goto LAB_0012a84d;
              }
              break;
            case MULTILAYER_USE_CASE_444:
              if (2 < uVar15 - 2) {
                pcVar21 = 
                "Error: for use_case %d, all layers must be of type %d, %d, or %d, found %d for layer %d (zero-based index)\n"
                ;
                uVar33 = 0xc;
                uVar32 = 2;
                uVar34 = 3;
                uVar35 = 4;
                uVar17 = (ulong)uVar15;
                uVar31 = uVar27;
                goto LAB_0012a649;
              }
              break;
            case MULTILAYER_USE_CASE_420_444:
              if (4 < uVar15) {
                uVar32 = 0xd;
                uVar34 = 1;
                uVar24 = 2;
                uVar26 = 3;
                uVar29 = 4;
                goto LAB_0012a84d;
              }
            }
          }
          uVar35 = (ulong)pbVar20[-0xb];
          uVar31 = 1;
          iVar25 = 1 << ((byte)uVar27 & 0x1f);
          if (iVar25 <= (int)(uint)pbVar20[-0xb]) {
            pcVar21 = 
            "Error: layer_dependency_idc of layer %d (zero-based index) must be in [0, %d], found %d for layer %d (zero-based index)\n"
            ;
            uVar33 = uVar27 & 0xffffffff;
            uVar17 = (ulong)(iVar25 - 1);
            goto LAB_0012a594;
          }
          if ((uVar15 - 5 < 2) && (*pbVar20 == true)) {
            pcVar21 = 
            "Error: alpha or depth layers cannot have layer_color_description for layer %d (zero-based index)\n"
            ;
            uVar17 = uVar27;
            goto LAB_0012a5b9;
          }
          pbVar20 = pbVar20 + 100;
        }
        bVar12 = true;
      }
      else {
        pcVar21 = "Error: Too many layers, found %d, max 4\n";
LAB_0012a5b9:
        bVar12 = false;
        fprintf(_stderr,pcVar21,uVar17 & 0xffffffff);
      }
      goto LAB_0012a7a4;
    }
    fwrite("Error: No layers found, there must be at least one\n",0x33,1,_stderr);
  }
LAB_0012a7a2:
  bVar12 = false;
LAB_0012a7a4:
  std::ifstream::~ifstream(&file);
  return bVar12;
}

Assistant:

bool parse_multilayer_file(const char *metadata_path,
                           MultilayerMetadata *multilayer) {
  std::ifstream file(metadata_path);
  if (!file.is_open()) {
    fprintf(stderr, "Error: Failed to open %s\n", metadata_path);
    return false;
  }

  if (!parse_multilayer_metadata(file, multilayer) ||
      !validate_multilayer_metadata(*multilayer)) {
    return false;
  }
  return multilayer;
}